

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomElementPrivate * __thiscall QDomDocumentPrivate::documentElement(QDomDocumentPrivate *this)

{
  QDomElementPrivate *pQVar1;
  int iVar2;
  QDomNodePrivate **ppQVar3;
  
  ppQVar3 = &(this->super_QDomNodePrivate).first;
  while( true ) {
    pQVar1 = (QDomElementPrivate *)*ppQVar3;
    if (pQVar1 == (QDomElementPrivate *)0x0) {
      return (QDomElementPrivate *)0x0;
    }
    iVar2 = (*(pQVar1->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(pQVar1);
    if (iVar2 == 1) break;
    ppQVar3 = &(pQVar1->super_QDomNodePrivate).next;
  }
  return pQVar1;
}

Assistant:

QDomElementPrivate* QDomDocumentPrivate::documentElement()
{
    QDomNodePrivate *p = first;
    while (p && !p->isElement())
        p = p->next;

    return static_cast<QDomElementPrivate *>(p);
}